

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::generateBufferBackedArrayStrideTypeAggregateSubCases
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup,
               string *namePrefix,ProgramInterface interface,DataType type,int expandLevel)

{
  Variable *this;
  ResourceTestCase *this_00;
  char *name;
  Node *ptr;
  ArrayElement *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [8];
  SharedPtr arrayElement;
  SharedPtr structMember;
  undefined1 local_40 [8];
  SharedPtr variable;
  DataType type_local;
  ProgramInterface interface_local;
  string *namePrefix_local;
  TestCaseGroup *targetGroup_local;
  SharedPtr *parentStructure_local;
  Context *context_local;
  
  variable.m_state._0_4_ = type;
  variable.m_state._4_4_ = interface;
  this = (Variable *)operator_new(0x28);
  ResourceDefinition::Variable::Variable(this,parentStructure,(DataType)variable.m_state);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)local_40,(Node *)this);
  this_00 = (ResourceTestCase *)operator_new(0xb0);
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            ((ProgramResourceQueryTestTarget *)((long)&structMember.m_state + 4),
             variable.m_state._4_4_,4);
  name = (char *)std::__cxx11::string::c_str();
  ResourceTestCase::ResourceTestCase
            (this_00,context,(SharedPtr *)local_40,
             (ProgramResourceQueryTestTarget *)((long)&structMember.m_state + 4),name);
  tcu::TestNode::addChild(&targetGroup->super_TestNode,(TestNode *)this_00);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)local_40);
  if (0 < expandLevel) {
    ptr = (Node *)operator_new(0x20);
    ResourceDefinition::StructMember::StructMember((StructMember *)ptr,parentStructure);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)&arrayElement.m_state,ptr);
    this_01 = (ArrayElement *)operator_new(0x28);
    ResourceDefinition::ArrayElement::ArrayElement(this_01,parentStructure,-1);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)local_78,(Node *)this_01);
    std::operator+(&local_98,namePrefix,"_struct");
    generateBufferBackedArrayStrideTypeAggregateSubCases
              (context,(SharedPtr *)&arrayElement.m_state,targetGroup,&local_98,
               variable.m_state._4_4_,(DataType)variable.m_state,expandLevel + -1);
    std::__cxx11::string::~string((string *)&local_98);
    std::operator+(&local_b8,namePrefix,"_array");
    generateBufferBackedArrayStrideTypeAggregateSubCases
              (context,(SharedPtr *)local_78,targetGroup,&local_b8,variable.m_state._4_4_,
               (DataType)variable.m_state,expandLevel + -1);
    std::__cxx11::string::~string((string *)&local_b8);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)local_78);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                *)&arrayElement.m_state);
  }
  return;
}

Assistant:

static void generateBufferBackedArrayStrideTypeAggregateSubCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup, const std::string& namePrefix, ProgramInterface interface, glu::DataType type, int expandLevel)
{
	// case
	{
		const ResourceDefinition::Node::SharedPtr variable(new ResourceDefinition::Variable(parentStructure, type));
		targetGroup->addChild(new ResourceTestCase(context, variable, ProgramResourceQueryTestTarget(interface, PROGRAMRESOURCEPROP_ARRAY_STRIDE), namePrefix.c_str()));
	}

	if (expandLevel > 0)
	{
		const ResourceDefinition::Node::SharedPtr	structMember	(new ResourceDefinition::StructMember(parentStructure));
		const ResourceDefinition::Node::SharedPtr	arrayElement	(new ResourceDefinition::ArrayElement(parentStructure));

		// _struct
		generateBufferBackedArrayStrideTypeAggregateSubCases(context, structMember, targetGroup, namePrefix + "_struct", interface, type, expandLevel - 1);

		// _array
		generateBufferBackedArrayStrideTypeAggregateSubCases(context, arrayElement, targetGroup, namePrefix + "_array", interface, type, expandLevel - 1);
	}
}